

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_impl.cc
# Opt level: O1

Status __thiscall leveldb::DBImpl::TEST_CompactMemTable(DBImpl *this)

{
  int iVar1;
  _func_int **pp_Var2;
  long *in_RSI;
  bool bVar3;
  
  (**(code **)(*in_RSI + 0x20))();
  if ((this->super_DB)._vptr_DB == (_func_int **)0x0) {
    iVar1 = pthread_mutex_lock((pthread_mutex_t *)(in_RSI + 0x119));
    if (iVar1 != 0) {
      std::__throw_system_error(iVar1);
    }
    bVar3 = in_RSI[0x127] != 0;
    if ((bVar3) && (in_RSI[0x145] == 0)) {
      do {
        std::condition_variable::wait((unique_lock *)(in_RSI + 0x11f));
        bVar3 = in_RSI[0x127] != 0;
        if (in_RSI[0x127] == 0) break;
      } while (in_RSI[0x145] == 0);
    }
    if ((bVar3) && (pp_Var2 = (this->super_DB)._vptr_DB, pp_Var2 != (_func_int **)in_RSI[0x145])) {
      if (pp_Var2 != (_func_int **)0x0) {
        operator_delete__(pp_Var2);
      }
      if ((char *)in_RSI[0x145] == (char *)0x0) {
        pp_Var2 = (_func_int **)0x0;
      }
      else {
        pp_Var2 = (_func_int **)Status::CopyState((char *)in_RSI[0x145]);
      }
      (this->super_DB)._vptr_DB = pp_Var2;
    }
    pthread_mutex_unlock((pthread_mutex_t *)(in_RSI + 0x119));
  }
  return (Status)(char *)this;
}

Assistant:

Status DBImpl::TEST_CompactMemTable() {
  // nullptr batch means just wait for earlier writes to be done
  Status s = Write(WriteOptions(), nullptr);
  if (s.ok()) {
    // Wait until the compaction completes
    MutexLock l(&mutex_);
    while (imm_ != nullptr && bg_error_.ok()) {
      background_work_finished_signal_.Wait();
    }
    if (imm_ != nullptr) {
      s = bg_error_;
    }
  }
  return s;
}